

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_param_list(Parser *this)

{
  string *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Tokenizer *pTVar2;
  int iVar3;
  const_iterator cVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  int n_args;
  string type;
  string kind;
  string name;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  Symbol_Table *local_38;
  
  poVar6 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\t<param_list>",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_58 = &local_48;
  n_args = 0;
  local_50 = 0;
  local_48 = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ARG","");
  __k = &this->cur_token;
  paVar1 = &local_d8.field_2;
  local_38 = &this->symbol_table;
  do {
    pTVar2 = this->tokenizer;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(pTVar2->type_map)._M_t,__k);
    if (n_args == 0 &&
        (_Rb_tree_header *)cVar4._M_node == &(pTVar2->type_map)._M_t._M_impl.super__Rb_tree_header)
    {
      n_args = 0;
      break;
    }
    if (n_args != 0) {
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,",","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"identifier","");
      check_expected_x_after_y(this,&local_d8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      poVar6 = (ostream *)this->out_file;
      std::operator+(&local_b8,"\t\t\t<symbol>",__k);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_d8.field_2._M_allocated_capacity = *psVar7;
        local_d8.field_2._8_8_ = plVar5[3];
        local_d8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar7;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      query_tokenizer(this);
    }
    poVar6 = (ostream *)this->out_file;
    std::operator+(&local_b8,"\t\t\t<keyword>",__k);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8.field_2._8_8_ = plVar5[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_98);
    query_tokenizer(this);
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"IDENTIFIER","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"type","");
    check_token_type_x_after_y(this,&local_d8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    poVar6 = (ostream *)this->out_file;
    std::operator+(&local_b8,"\t\t\t<identifier>",__k);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8.field_2._8_8_ = plVar5[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    Symbol_Table::set_data(local_38,__k,&local_98,&local_78);
    query_tokenizer(this);
    Tokenizer::get_current_token_abi_cxx11_(&local_d8,this->tokenizer);
    iVar3 = std::__cxx11::string::compare((char *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    n_args = n_args + 1;
  } while (iVar3 != 0);
  poVar6 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\t</param_list>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  Symbol_Table::set_temp_arg_count(local_38,n_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void Parser::parse_param_list() {
    out_file << "\t\t<param_list>" << std::endl;
    std::string name, type, kind = "ARG";


    int param_counter = 0;
    while(tokenizer.type_exists(cur_token) || param_counter > 0) {

        if (param_counter > 0) {
            check_expected_x_after_y(",", "identifier");
            out_file <<"\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
            query_tokenizer();
        }

        out_file << "\t\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        type = cur_token;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "type");
        out_file << "\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        symbol_table.set_data(cur_token, type, kind);
        query_tokenizer();
        param_counter++;

        if (tokenizer.get_current_token() == ")") {
            break;
        }
    }

    out_file << "\t\t</param_list>" << std::endl;
    symbol_table.set_temp_arg_count(param_counter);
}